

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  ZSTD_dStage ZVar8;
  void *pvVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  ulong dstCapacity;
  void *src_00;
  void *pvVar17;
  void *src_01;
  void *local_a0;
  
  uVar16 = input->pos;
  uVar2 = input->size;
  sVar11 = 0xffffffffffffffb8;
  if (uVar16 <= uVar2) {
    uVar3 = output->size;
    sVar11 = 0xffffffffffffffba;
    if (output->pos <= uVar3) {
      src_00 = (void *)(uVar16 + (long)input->src);
      pvVar15 = (void *)(uVar2 + (long)input->src);
      pvVar4 = output->dst;
      pvVar9 = (void *)(output->pos + (long)pvVar4);
      src = zds->headerBuffer;
      local_a0 = pvVar9;
      pvVar17 = src_00;
LAB_0015adaa:
      dstCapacity = (long)pvVar4 + (uVar3 - (long)local_a0);
      src_01 = pvVar17;
LAB_0015adb7:
      pvVar17 = src_01;
      switch(zds->streamStage) {
      case zdss_init:
        zds->streamStage = zdss_loadHeader;
        zds->inPos = 0;
        zds->legacyVersion = 0;
        zds->hostageByte = 0;
        zds->lhSize = 0;
        zds->outStart = 0;
        zds->outEnd = 0;
        sVar11 = 0;
        break;
      case zdss_loadHeader:
        sVar11 = zds->lhSize;
        break;
      case zdss_read:
        goto switchD_0015add6_caseD_2;
      case zdss_load:
        sVar11 = zds->expected;
        goto LAB_0015b06f;
      case zdss_flush:
        goto switchD_0015add6_caseD_4;
      default:
        return 0xffffffffffffffff;
      }
      sVar11 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar11,zds->format);
      if (0xffffffffffffff88 < sVar11) {
        return sVar11;
      }
      if (sVar11 == 0) {
        uVar13 = (zds->fParams).frameContentSize;
        if ((((uVar13 != 0) && ((zds->fParams).windowSize != 0)) && (uVar13 <= dstCapacity)) &&
           (sVar11 = ZSTD_findFrameCompressedSize(src_00,uVar2 - uVar16), sVar11 <= uVar2 - uVar16))
        {
          sVar6 = ZSTD_decompressMultiFrame
                            (zds,local_a0,dstCapacity,src_00,sVar11,(void *)0x0,0,zds->ddict);
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
          pvVar17 = (void *)(sVar11 + (long)src_00);
          local_a0 = (void *)((long)local_a0 + sVar6);
          zds->expected = 0;
LAB_0015b37c:
          zds->streamStage = zdss_init;
          goto LAB_0015b38a;
        }
        ZSTD_decompressBegin_usingDDict(zds,zds->ddict);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar13 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar8 = ZSTDds_skipFrame;
        }
        else {
          sVar11 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
          if (0xffffffffffffff88 < sVar11) {
            return sVar11;
          }
          ZVar8 = ZSTDds_decodeBlockHeader;
          uVar13 = 3;
        }
        zds->expected = uVar13;
        zds->stage = ZVar8;
        uVar13 = (zds->fParams).windowSize;
        if (uVar13 < 0x401) {
          uVar13 = 0x400;
        }
        (zds->fParams).windowSize = uVar13;
        if (zds->maxWindowSize < uVar13) {
          return 0xfffffffffffffff0;
        }
        uVar1 = (zds->fParams).blockSizeMax;
        if (uVar1 < 5) {
          uVar1 = 4;
        }
        uVar12 = (ulong)uVar1;
        uVar14 = (zds->fParams).frameContentSize;
        uVar10 = 0x20000;
        if (uVar13 < 0x20000) {
          uVar10 = uVar13;
        }
        uVar13 = uVar13 + uVar10 + 0x10;
        if (uVar13 < uVar14) {
          uVar14 = uVar13;
        }
        if ((zds->inBuffSize < uVar12) || (zds->outBuffSize < uVar14)) {
          if (zds->staticSize == 0) {
            ZSTD_free(zds->inBuff,zds->customMem);
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            pcVar5 = (char *)ZSTD_malloc(uVar12 + uVar14,zds->customMem);
            zds->inBuff = pcVar5;
            if (pcVar5 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (zds->staticSize - 0x271e8 < uVar12 + uVar14) {
              return 0xffffffffffffffc0;
            }
            pcVar5 = zds->inBuff;
          }
          zds->inBuffSize = uVar12;
          zds->outBuff = pcVar5 + uVar12;
          zds->outBuffSize = uVar14;
        }
        zds->streamStage = zdss_read;
switchD_0015add6_caseD_2:
        sVar11 = zds->expected;
        if (sVar11 == 0) goto LAB_0015b37c;
        if ((ulong)((long)pvVar15 - (long)src_01) < sVar11) {
          pvVar17 = pvVar15;
          if (src_01 == pvVar15) goto LAB_0015b38a;
          zds->streamStage = zdss_load;
LAB_0015b06f:
          sVar6 = zds->inPos;
          uVar13 = sVar11 - sVar6;
          ZVar8 = zds->stage;
          if (ZVar8 == ZSTDds_skipFrame) {
            uVar14 = (long)pvVar15 - (long)src_01;
            if (uVar13 < (ulong)((long)pvVar15 - (long)src_01)) {
              uVar14 = uVar13;
            }
          }
          else {
            if (zds->inBuffSize - sVar6 < uVar13) {
              return 0xffffffffffffffec;
            }
            uVar14 = (long)pvVar15 - (long)src_01;
            if (uVar13 < (ulong)((long)pvVar15 - (long)src_01)) {
              uVar14 = uVar13;
            }
            memcpy(zds->inBuff + sVar6,src_01,uVar14);
            sVar6 = zds->inPos;
          }
          pvVar17 = (void *)((long)src_01 + uVar14);
          zds->inPos = sVar6 + uVar14;
          if (uVar14 < uVar13) goto LAB_0015b38a;
          sVar6 = ZSTD_decompressContinue
                            (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                             zds->inBuff,sVar11);
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
          zds->inPos = 0;
          if ((ZVar8 == ZSTDds_skipFrame) || (sVar6 != 0)) {
            sVar11 = zds->outStart;
            sVar6 = sVar6 + sVar11;
            zds->outEnd = sVar6;
            zds->streamStage = zdss_flush;
            goto LAB_0015b201;
          }
          zds->streamStage = zdss_read;
          src_01 = pvVar17;
        }
        else {
          ZVar8 = zds->stage;
          if (ZVar8 == ZSTDds_skipFrame) {
            sVar6 = 0;
          }
          else {
            sVar6 = zds->outBuffSize - zds->outStart;
          }
          sVar6 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar6,src_01,sVar11);
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
          src_01 = (void *)((long)src_01 + sVar11);
          if ((ZVar8 == ZSTDds_skipFrame) || (sVar6 != 0)) {
            zds->outEnd = zds->outStart + sVar6;
            zds->streamStage = zdss_flush;
          }
        }
      }
      else {
        sVar6 = zds->lhSize;
        uVar14 = sVar11 - sVar6;
        uVar13 = (long)pvVar15 - (long)src_01;
        if (uVar13 < uVar14) {
          if (pvVar15 != src_01) {
            memcpy(src + sVar6,src_01,uVar13);
            sVar6 = uVar13 + zds->lhSize;
            zds->lhSize = sVar6;
          }
          sVar7 = 6;
          if (6 < sVar11) {
            sVar7 = sVar11;
          }
          input->pos = input->size;
          return (sVar7 - sVar6) + 3;
        }
        memcpy(src + sVar6,src_01,uVar14);
        zds->lhSize = sVar11;
        src_01 = (void *)((long)src_01 + uVar14);
      }
      goto LAB_0015adb7;
    }
  }
  return sVar11;
switchD_0015add6_caseD_4:
  sVar11 = zds->outStart;
  sVar6 = zds->outEnd;
LAB_0015b201:
  uVar14 = sVar6 - sVar11;
  uVar13 = uVar14;
  if (dstCapacity < uVar14) {
    uVar13 = dstCapacity;
  }
  memcpy(local_a0,zds->outBuff + sVar11,uVar13);
  local_a0 = (void *)((long)local_a0 + uVar13);
  sVar11 = uVar13 + zds->outStart;
  zds->outStart = sVar11;
  if (dstCapacity < uVar14) {
LAB_0015b38a:
    uVar16 = (long)pvVar17 + (input->pos - (long)src_00);
    input->pos = uVar16;
    output->pos = (long)local_a0 + (output->pos - (long)pvVar9);
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd != zds->outStart) {
      if (zds->hostageByte == 0) {
        input->pos = uVar16 - 1;
        zds->hostageByte = 1;
        return 1;
      }
      return 1;
    }
    if (zds->hostageByte != 0) {
      if (input->size <= uVar16) {
        zds->streamStage = zdss_read;
        return 1;
      }
      input->pos = uVar16 + 1;
    }
    return 0;
  }
  zds->streamStage = zdss_read;
  if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
     (zds->outBuffSize < sVar11 + (zds->fParams).blockSizeMax)) {
    zds->outStart = 0;
    zds->outEnd = 0;
  }
  goto LAB_0015adaa;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? zds->ddict->dictContent : NULL;
                        size_t const dictSize = zds->ddict ? zds->ddict->dictSize : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_frameHeaderSize_min, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_frameIdSize);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default: return ERROR(GENERIC);   /* impossible */
    }   }

    /* result */
    input->pos += (size_t)(ip-istart);
    output->pos += (size_t)(op-ostart);
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}